

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O2

void test_iterator_reuse_retry_count(int retry_count)

{
  roaring_bitmap_t *r;
  uint32_t uVar1;
  _Bool _Var2;
  roaring_bitmap_t *r_00;
  roaring_bitmap_t *r_01;
  uint64_t uVar3;
  uint64_t uVar4;
  uint uVar5;
  int iVar6;
  uint32_t i;
  ulong uVar8;
  ulong uVar9;
  uint32_t ref_count;
  roaring_bitmap_t *bitmaps [2];
  roaring_uint32_iterator_t iterator;
  uint32_t *ref_values;
  ulong uVar7;
  
  test_iterator_generate_data(&ref_values,&ref_count);
  r_00 = roaring_bitmap_create();
  r_01 = roaring_bitmap_create();
  for (uVar8 = 0; ref_count != uVar8; uVar8 = uVar8 + 1) {
    roaring_bitmap_add(r_00,ref_values[uVar8]);
    if (ref_count - 1 != uVar8 && uVar8 != 0) {
      roaring_bitmap_add(r_01,ref_values[uVar8]);
    }
  }
  uVar9 = 0;
  _Var2 = roaring_bitmap_contains(r_00,0);
  _assert_true((ulong)_Var2,"roaring_bitmap_contains(with_edges, 0)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0xff7);
  _Var2 = roaring_bitmap_contains(r_00,0xffffffff);
  _assert_true((ulong)_Var2,"roaring_bitmap_contains(with_edges, UINT32_MAX)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0xff8);
  _Var2 = roaring_bitmap_contains(r_01,0);
  _assert_true((ulong)!_Var2,"!roaring_bitmap_contains(without_edges, 0)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0xff9);
  _Var2 = roaring_bitmap_contains(r_01,0xffffffff);
  _assert_true((ulong)!_Var2,"!roaring_bitmap_contains(without_edges, UINT32_MAX)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0xffa);
  uVar3 = roaring_bitmap_get_cardinality(r_00);
  uVar4 = roaring_bitmap_get_cardinality(r_01);
  _assert_true((ulong)(uVar3 - 2 == uVar4),
               "roaring_bitmap_get_cardinality(with_edges) - 2 == roaring_bitmap_get_cardinality(without_edges)"
               ,
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0xffc);
  bitmaps[0] = r_00;
  bitmaps[1] = r_01;
  uVar8 = (ulong)(uint)retry_count;
  if (retry_count < 1) {
    uVar8 = uVar9;
  }
  for (; uVar9 != 2; uVar9 = uVar9 + 1) {
    r = bitmaps[uVar9];
    roaring_iterator_init(r,&iterator);
    _assert_true((ulong)iterator.has_value,"iterator.has_value",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                 ,0x1004);
    uVar1 = iterator.current_value;
    uVar5 = 0;
    while (iterator.has_value == true) {
      uVar5 = uVar5 + 1;
      roaring_uint32_iterator_advance(&iterator);
    }
    uVar3 = roaring_bitmap_get_cardinality(r);
    _assert_true((ulong)(uVar3 == uVar5),"count == roaring_bitmap_get_cardinality(bitmaps[i])",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                 ,0x100c);
    uVar7 = uVar8;
    while (iVar6 = (int)uVar7, uVar7 = (ulong)(iVar6 - 1), iVar6 != 0) {
      roaring_uint32_iterator_advance(&iterator);
    }
    uVar5 = 0xffffffff;
    do {
      roaring_uint32_iterator_previous(&iterator);
      uVar5 = uVar5 + 1;
    } while (iterator.has_value != false);
    uVar3 = roaring_bitmap_get_cardinality(r);
    _assert_true((ulong)(uVar3 == uVar5),"count == roaring_bitmap_get_cardinality(bitmaps[i])",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                 ,0x101a);
    uVar7 = uVar8;
    while (iVar6 = (int)uVar7, uVar7 = (ulong)(iVar6 - 1), iVar6 != 0) {
      roaring_uint32_iterator_previous(&iterator);
    }
    roaring_uint32_iterator_advance(&iterator);
    _assert_true((ulong)iterator.has_value,"iterator.has_value",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                 ,0x1022);
    _assert_true((ulong)(uVar1 == iterator.current_value),"first_value == iterator.current_value",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                 ,0x1023);
  }
  roaring_bitmap_free(r_01);
  roaring_bitmap_free(r_00);
  free(ref_values);
  return;
}

Assistant:

void test_iterator_reuse_retry_count(int retry_count) {
    uint32_t *ref_values;
    uint32_t ref_count;
    test_iterator_generate_data(&ref_values, &ref_count);

    roaring_bitmap_t *with_edges = roaring_bitmap_create();
    // We don't want min and max values inside this bitmap
    roaring_bitmap_t *without_edges = roaring_bitmap_create();

    for (uint32_t i = 0; i < ref_count; i++) {
        roaring_bitmap_add(with_edges, ref_values[i]);
        if (i != 0 && i != ref_count - 1) {
            roaring_bitmap_add(without_edges, ref_values[i]);
        }
    }

    // sanity checks
    assert_true(roaring_bitmap_contains(with_edges, 0));
    assert_true(roaring_bitmap_contains(with_edges, UINT32_MAX));
    assert_true(!roaring_bitmap_contains(without_edges, 0));
    assert_true(!roaring_bitmap_contains(without_edges, UINT32_MAX));
    assert_true(roaring_bitmap_get_cardinality(with_edges) - 2 ==
                roaring_bitmap_get_cardinality(without_edges));

    const roaring_bitmap_t *bitmaps[] = {with_edges, without_edges};
    int num_bitmaps = sizeof(bitmaps) / sizeof(bitmaps[0]);

    for (int i = 0; i < num_bitmaps; ++i) {
        roaring_uint32_iterator_t iterator;
        roaring_iterator_init(bitmaps[i], &iterator);
        assert_true(iterator.has_value);
        uint32_t first_value = iterator.current_value;

        uint32_t count = 0;
        while (iterator.has_value) {
            count++;
            roaring_uint32_iterator_advance(&iterator);
        }
        assert_true(count == roaring_bitmap_get_cardinality(bitmaps[i]));

        // Test advancing the iterator more times than necessary
        for (int retry = 0; retry < retry_count; ++retry) {
            roaring_uint32_iterator_advance(&iterator);
        }

        // Using same iterator we want to go backwards through the list
        roaring_uint32_iterator_previous(&iterator);
        count = 0;
        while (iterator.has_value) {
            count++;
            roaring_uint32_iterator_previous(&iterator);
        }
        assert_true(count == roaring_bitmap_get_cardinality(bitmaps[i]));

        // Test decrement the iterator more times than necessary
        for (int retry = 0; retry < retry_count; ++retry) {
            roaring_uint32_iterator_previous(&iterator);
        }

        roaring_uint32_iterator_advance(&iterator);
        assert_true(iterator.has_value);
        assert_true(first_value == iterator.current_value);
    }

    roaring_bitmap_free(without_edges);
    roaring_bitmap_free(with_edges);
    free(ref_values);
}